

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O3

string * __thiscall
muduo::formatIEC_abi_cxx11_(string *__return_storage_ptr__,muduo *this,int64_t s)

{
  size_t sVar1;
  char *__format;
  double dVar2;
  double dVar3;
  char buf [64];
  char acStack_58 [72];
  
  if ((long)this < 0x400) {
    snprintf(acStack_58,0x40,"%ld");
  }
  else {
    dVar2 = (double)(long)this;
    if (this < (muduo *)0x27fb) {
      dVar3 = dVar2 * 0.0009765625;
      __format = "%.2fKi";
    }
    else if (this < (muduo *)0x18fcd) {
      dVar3 = dVar2 * 0.0009765625;
      __format = "%.1fKi";
    }
    else if (this < (muduo *)0xffe00) {
      dVar3 = dVar2 * 0.0009765625;
      __format = "%.0fKi";
    }
    else if (this < (muduo *)0x9feb86) {
      dVar3 = dVar2 * 9.5367431640625e-07;
      __format = "%.2fMi";
    }
    else if (this < (muduo *)0x63f3334) {
      dVar3 = dVar2 * 9.5367431640625e-07;
      __format = "%.1fMi";
    }
    else if (this < (muduo *)0x3ff80000) {
      dVar3 = dVar2 * 9.5367431640625e-07;
      __format = "%.0fMi";
    }
    else if (this < (muduo *)0x27fae147b) {
      dVar3 = dVar2 * 9.313225746154785e-10;
      __format = "%.2fGi";
    }
    else if (this < (muduo *)0x18fccccccd) {
      dVar3 = dVar2 * 9.313225746154785e-10;
      __format = "%.1fGi";
    }
    else if ((ulong)this >> 0x1d < 0x7ff) {
      dVar3 = dVar2 * 9.313225746154785e-10;
      __format = "%.0fGi";
    }
    else if (this < (muduo *)0x9feb851eb86) {
      dVar3 = dVar2 * 9.094947017729282e-13;
      __format = "%.2fTi";
    }
    else if (this < (muduo *)0x63f333333334) {
      dVar3 = dVar2 * 9.094947017729282e-13;
      __format = "%.1fTi";
    }
    else if ((uint)((ulong)this >> 0x27) < 0x7ff) {
      dVar3 = dVar2 * 9.094947017729282e-13;
      __format = "%.0fTi";
    }
    else if (11253369568892026.0 <= dVar2) {
      if (1.1253369568892027e+17 <= dVar2) {
        if (1.1523585546534257e+18 <= dVar2) {
          dVar3 = dVar2 * 8.673617379884035e-19;
          if (1.1523450438545435e+19 <= dVar2) {
            __format = "%.1fEi";
          }
          else {
            __format = "%.2fEi";
          }
        }
        else {
          dVar3 = dVar2 * 8.881784197001252e-16;
          __format = "%.0fPi";
        }
      }
      else {
        dVar3 = dVar2 * 8.881784197001252e-16;
        __format = "%.1fPi";
      }
    }
    else {
      dVar3 = dVar2 * 8.881784197001252e-16;
      __format = "%.2fPi";
    }
    snprintf(acStack_58,0x40,__format,dVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_58,acStack_58 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string formatIEC(int64_t s)
{
  double n = static_cast<double>(s);
  char buf[64];
  const double Ki = 1024.0;
  const double Mi = Ki * 1024.0;
  const double Gi = Mi * 1024.0;
  const double Ti = Gi * 1024.0;
  const double Pi = Ti * 1024.0;
  const double Ei = Pi * 1024.0;

  if (n < Ki)
    snprintf(buf, sizeof buf, "%" PRId64, s);
  else if (n < Ki*9.995)
    snprintf(buf, sizeof buf, "%.2fKi", n / Ki);
  else if (n < Ki*99.95)
    snprintf(buf, sizeof buf, "%.1fKi", n / Ki);
  else if (n < Ki*1023.5)
    snprintf(buf, sizeof buf, "%.0fKi", n / Ki);

  else if (n < Mi*9.995)
    snprintf(buf, sizeof buf, "%.2fMi", n / Mi);
  else if (n < Mi*99.95)
    snprintf(buf, sizeof buf, "%.1fMi", n / Mi);
  else if (n < Mi*1023.5)
    snprintf(buf, sizeof buf, "%.0fMi", n / Mi);

  else if (n < Gi*9.995)
    snprintf(buf, sizeof buf, "%.2fGi", n / Gi);
  else if (n < Gi*99.95)
    snprintf(buf, sizeof buf, "%.1fGi", n / Gi);
  else if (n < Gi*1023.5)
    snprintf(buf, sizeof buf, "%.0fGi", n / Gi);

  else if (n < Ti*9.995)
    snprintf(buf, sizeof buf, "%.2fTi", n / Ti);
  else if (n < Ti*99.95)
    snprintf(buf, sizeof buf, "%.1fTi", n / Ti);
  else if (n < Ti*1023.5)
    snprintf(buf, sizeof buf, "%.0fTi", n / Ti);

  else if (n < Pi*9.995)
    snprintf(buf, sizeof buf, "%.2fPi", n / Pi);
  else if (n < Pi*99.95)
    snprintf(buf, sizeof buf, "%.1fPi", n / Pi);
  else if (n < Pi*1023.5)
    snprintf(buf, sizeof buf, "%.0fPi", n / Pi);

  else if (n < Ei*9.995)
    snprintf(buf, sizeof buf, "%.2fEi", n / Ei );
  else
    snprintf(buf, sizeof buf, "%.1fEi", n / Ei );
  return buf;
}